

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGen.c
# Opt level: O2

int Gia_ManSimulateWordsInit(Gia_Man_t *p,Vec_Wrd_t *vSimsIn)

{
  int iVar1;
  int iVar2;
  Vec_Wrd_t *pVVar3;
  Gia_Obj_t *pGVar4;
  word *__dest;
  word *__src;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  int v;
  
  iVar7 = p->vCis->nSize;
  iVar1 = vSimsIn->nSize / iVar7;
  if (vSimsIn->nSize != iVar7 * iVar1) {
    __assert_fail("Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                  ,0x75,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
  }
  Vec_WrdFreeP(&p->vSims);
  pVVar3 = Vec_WrdStart(p->nObjs * iVar1);
  p->vSims = pVVar3;
  p->nSimWords = iVar1;
  iVar7 = 0;
  for (v = 0; v < p->vCis->nSize; v = v + 1) {
    pGVar4 = Gia_ManCi(p,v);
    iVar2 = Gia_ObjId(p,pGVar4);
    if (iVar2 == 0) break;
    __dest = Vec_WrdEntryP(p->vSims,iVar2 * iVar1);
    __src = Vec_WrdEntryP(vSimsIn,iVar7);
    memcpy(__dest,__src,(long)iVar1 << 3);
    iVar7 = iVar7 + iVar1;
  }
  iVar7 = 1;
  while( true ) {
    if (p->nObjs <= iVar7) {
      return 1;
    }
    pGVar4 = Gia_ManObj(p,iVar7);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    uVar6 = (uint)*(ulong *)pGVar4;
    uVar5 = *(ulong *)pGVar4 & 0x1fffffff;
    if (uVar5 == 0x1fffffff || (int)uVar6 < 0) {
      if ((~uVar6 & 0x9fffffff) != 0) {
        if ((-1 < (int)uVar6) || ((int)uVar5 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaGen.c"
                        ,0x86,"int Gia_ManSimulateWordsInit(Gia_Man_t *, Vec_Wrd_t *)");
        }
        Gia_ManObjSimPo(p,iVar7);
      }
    }
    else {
      Gia_ManObjSimAnd(p,iVar7);
    }
    iVar7 = iVar7 + 1;
  }
  return 1;
}

Assistant:

int Gia_ManSimulateWordsInit( Gia_Man_t * p, Vec_Wrd_t * vSimsIn )
{
    Gia_Obj_t * pObj; int i, Id;
    int nWords = Vec_WrdSize(vSimsIn) / Gia_ManCiNum(p);
    assert( Vec_WrdSize(vSimsIn) == nWords * Gia_ManCiNum(p) );
    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;
    // set input sim info
    Gia_ManForEachCiId( p, Id, i )
        memcpy( Vec_WrdEntryP(p->vSims, Id*nWords), Vec_WrdEntryP(vSimsIn, i*nWords), sizeof(word)*nWords );
    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Gia_ManObjSimAnd( p, i );
        else if ( Gia_ObjIsCi(pObj) )
            continue;
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ManObjSimPo( p, i );
        else assert( 0 );
    }
    return 1;
}